

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O0

ON_TextureCoordinates * __thiscall
ON_Mesh::SetCachedTextureCoordinatesEx
          (ON_Mesh *this,ON_TextureMapping *mapping,ON_Xform *mesh_xform,bool bLazy,bool bSeamCheck)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  ON_TextureCoordinates *pOVar4;
  ON_UUID *b;
  ON_3fPoint *mesh_T_00;
  int *local_3b0;
  bool local_30a;
  ON_3dPoint local_300;
  ON_3fPoint *local_2e8;
  ON_3fPoint *meshT;
  int vcnt;
  int vi;
  ON_3dPoint T;
  int mesh_T_stride;
  float *mesh_T;
  int tci;
  ON_Mesh *pOStack_2a0;
  int i;
  ON_TextureCoordinates *TC;
  ON_SimpleArray<int> *local_288;
  ON_SimpleArray<int> *Tsd;
  ON_SimpleArray<int> Tside;
  double two_pi_tc;
  ON_TextureMapping mp;
  bool bSeamCheck_local;
  bool bLazy_local;
  ON_Xform *mesh_xform_local;
  ON_TextureMapping *mapping_local;
  ON_Mesh *this_local;
  
  mp.m_mapping_primitive.super___shared_ptr<const_ON_Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi._6_1_ = bSeamCheck;
  mp.m_mapping_primitive.super___shared_ptr<const_ON_Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi._7_1_ = bLazy;
  bVar1 = ON_TextureMapping::RequiresVertexNormals(mapping);
  if ((bVar1) && (bVar1 = HasVertexNormals(this), !bVar1)) {
    ComputeVertexNormals(this);
  }
  ON_TextureMapping::ON_TextureMapping((ON_TextureMapping *)&two_pi_tc,mapping);
  Tside.m_count = 0;
  Tside.m_capacity = 0x3ff00000;
  ON_SimpleArray<int>::ON_SimpleArray((ON_SimpleArray<int> *)&Tsd);
  local_288 = (ON_SimpleArray<int> *)0x0;
  if ((mp.m_mapping_primitive.super___shared_ptr<const_ON_Object,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi._6_1_ & 1) != 0) {
    bVar1 = SeamCheckHelper((ON_TextureMapping *)&two_pi_tc,(double *)&Tside.m_count,
                            (ON_SimpleArray<int> *)&Tsd,&local_288);
    local_30a = false;
    if (bVar1) {
      local_30a = HasSharedVertices(this);
    }
    mp.m_mapping_primitive.super___shared_ptr<const_ON_Object,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi._6_1_ = local_30a;
    if (local_30a != false) {
      memcpy(mp.m_Nxyz.m_xform[3] + 3,&ON_Xform::IdentityTransformation,0x80);
    }
  }
  pOStack_2a0 = (ON_Mesh *)0x0;
  tci = 0;
  do {
    iVar2 = ON_ClassArray<ON_TextureCoordinates>::Count(&this->m_TC);
    if (iVar2 <= tci) {
LAB_006cd900:
      if ((((mp.m_mapping_primitive.super___shared_ptr<const_ON_Object,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi._7_1_ & 1) == 0) || (pOStack_2a0 == (ON_Mesh *)0x0)) ||
         (bVar1 = ON_TextureMapping::HasMatchingTextureCoordinates
                            (mapping,(ON_MappingTag *)pOStack_2a0,mesh_xform), !bVar1)) {
        if (pOStack_2a0 == (ON_Mesh *)0x0) {
          ON_ClassArray<ON_TextureCoordinates>::AppendNew(&this->m_TC);
          pOStack_2a0 = (ON_Mesh *)ON_ClassArray<ON_TextureCoordinates>::Last(&this->m_TC);
        }
        bVar1 = ON_TextureMapping::GetTextureCoordinates
                          ((ON_TextureMapping *)&two_pi_tc,this,
                           (ON_SimpleArray<ON_3fPoint> *)
                           &(pOStack_2a0->m_NgonAllocator).m_7.m_al_element_array,mesh_xform,false,
                           local_288);
        if (bVar1) {
          ON_MappingTag::Set((ON_MappingTag *)pOStack_2a0,mapping);
          if (((mesh_xform != (ON_Xform *)0x0) && (bVar1 = ON_Xform::IsValid(mesh_xform), bVar1)) &&
             ((bVar1 = ON_Xform::IsIdentity(mesh_xform,0.0), !bVar1 &&
              (bVar1 = ON_Xform::IsZero(mesh_xform), !bVar1)))) {
            memcpy((ON_Xform *)&(pOStack_2a0->m_dV).super_ON_SimpleArray<ON_3dPoint>.m_a,mesh_xform,
                   0x80);
          }
          *(undefined4 *)&(pOStack_2a0->m_NgonAllocator).m_7.m_al_block = 2;
          if (((mp.m_mapping_primitive.
                super___shared_ptr<const_ON_Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
                _6_1_ & 1) != 0) &&
             (iVar2 = ON_SimpleArray<ON_MeshFace>::Count(&this->m_F), 0 < iVar2)) {
            iVar2 = ON_SimpleArray<ON_3fPoint>::Count
                              ((ON_SimpleArray<ON_3fPoint> *)
                               &(pOStack_2a0->m_NgonAllocator).m_7.m_al_element_array);
            iVar3 = ON_SimpleArray<ON_3fPoint>::Count(&(this->m_V).super_ON_SimpleArray<ON_3fPoint>)
            ;
            if (iVar2 == iVar3) {
              mesh_T_00 = ON_SimpleArray<ON_3fPoint>::Array
                                    ((ON_SimpleArray<ON_3fPoint> *)
                                     &(pOStack_2a0->m_NgonAllocator).m_7.m_al_element_array);
              T.z._4_4_ = 3;
              if (local_288 != (ON_SimpleArray<int> *)0x0) {
                iVar2 = ON_SimpleArray<int>::Count((ON_SimpleArray<int> *)&Tsd);
                iVar3 = ON_SimpleArray<ON_3fPoint>::Count
                                  (&(this->m_V).super_ON_SimpleArray<ON_3fPoint>);
                if (iVar2 != iVar3) {
                  local_288 = (ON_SimpleArray<int> *)0x0;
                }
              }
              iVar2 = T.z._4_4_;
              if (local_288 == (ON_SimpleArray<int> *)0x0) {
                local_3b0 = (int *)0x0;
              }
              else {
                local_3b0 = ON_SimpleArray<int>::Array((ON_SimpleArray<int> *)&Tsd);
              }
              AdjustMeshPeriodicTextureCoordinatesHelper
                        (this,mesh_xform,&mesh_T_00->x,iVar2,local_3b0,(double)Tside._16_8_,
                         (ON_TextureMapping *)&two_pi_tc);
              bVar1 = ON_Xform::IsIdentity(&mapping->m_uvw,0.0);
              if ((!bVar1) && (bVar1 = ON_Xform::IsZero(&mapping->m_uvw), !bVar1)) {
                meshT._0_4_ = ON_SimpleArray<ON_3fPoint>::Count
                                        ((ON_SimpleArray<ON_3fPoint> *)
                                         &(pOStack_2a0->m_NgonAllocator).m_7.m_al_element_array);
                local_2e8 = ON_SimpleArray<ON_3fPoint>::Array
                                      ((ON_SimpleArray<ON_3fPoint> *)
                                       &(pOStack_2a0->m_NgonAllocator).m_7.m_al_element_array);
                for (meshT._4_4_ = 0; meshT._4_4_ < (int)meshT; meshT._4_4_ = meshT._4_4_ + 1) {
                  ON_3dPoint::operator=((ON_3dPoint *)&vcnt,local_2e8 + meshT._4_4_);
                  ON_Xform::operator*(&local_300,&mapping->m_uvw,(ON_3dPoint *)&vcnt);
                  T.y = local_300.z;
                  _vcnt = local_300.x;
                  T.x = local_300.y;
                  ON_3fPoint::operator=(local_2e8 + meshT._4_4_,(ON_3dPoint *)&vcnt);
                }
              }
            }
          }
          this_local = pOStack_2a0;
        }
        else {
          pOVar4 = ON_ClassArray<ON_TextureCoordinates>::Array(&this->m_TC);
          ON_ClassArray<ON_TextureCoordinates>::Remove
                    (&this->m_TC,(int)((ulong)((long)pOStack_2a0 - (long)pOVar4) >> 3) * -0x1642c859
                    );
          this_local = (ON_Mesh *)0x0;
        }
      }
      else {
        this_local = pOStack_2a0;
      }
      ON_SimpleArray<int>::~ON_SimpleArray((ON_SimpleArray<int> *)&Tsd);
      ON_TextureMapping::~ON_TextureMapping((ON_TextureMapping *)&two_pi_tc);
      return (ON_TextureCoordinates *)this_local;
    }
    pOVar4 = ON_ClassArray<ON_TextureCoordinates>::operator[](&this->m_TC,tci);
    b = ON_ModelComponent::Id(&mapping->super_ON_ModelComponent);
    bVar1 = ::operator==((ON_UUID_struct *)pOVar4,b);
    if (bVar1) {
      pOStack_2a0 = (ON_Mesh *)ON_ClassArray<ON_TextureCoordinates>::operator[](&this->m_TC,tci);
      goto LAB_006cd900;
    }
    tci = tci + 1;
  } while( true );
}

Assistant:

const ON_TextureCoordinates* ON_Mesh::SetCachedTextureCoordinatesEx(
        const class ON_TextureMapping& mapping,
        const class ON_Xform* mesh_xform,
        bool bLazy,
        bool bSeamCheck
        )
{
  if ( mapping.RequiresVertexNormals() && !HasVertexNormals() )
    ComputeVertexNormals();

  ON_TextureMapping mp = mapping;
  double two_pi_tc = 1.0;
  ON_SimpleArray<int> Tside;
  ON_SimpleArray<int>* Tsd = 0;

  if (bSeamCheck)
  {
    bSeamCheck = SeamCheckHelper(mp, two_pi_tc, Tside, Tsd) && HasSharedVertices(*this);
    if (bSeamCheck)
      mp.m_uvw = ON_Xform::IdentityTransformation;
  }

  ON_TextureCoordinates* TC = 0;
  {
    for ( int i = 0; i < m_TC.Count(); i++ )
    {
      if ( m_TC[i].m_tag.m_mapping_id == mapping.Id() )
      {
        TC = &m_TC[i];
        break;
      }
    }
  }
  if ( bLazy && TC && mapping.HasMatchingTextureCoordinates( TC->m_tag, mesh_xform ) )
    return TC;

  if ( !TC )
  {
    m_TC.AppendNew();
    TC = m_TC.Last();
  }

  // Use mp instead of mapping to call GetTextureCoordinates()
  // because m_uvw must be the identity if we have seams.
  if ( !mp.GetTextureCoordinates( *this,TC->m_T,mesh_xform,false,Tsd) )
  {
    int tci = (int)(TC - m_TC.Array());
    m_TC.Remove(tci);
    return 0;
  }

  TC->m_tag.Set(mapping);
  if (    mesh_xform && mesh_xform->IsValid()
       && !mesh_xform->IsIdentity()
       && !mesh_xform->IsZero()
     )
  {
    TC->m_tag.m_mesh_xform = *mesh_xform;
  }

  TC->m_dim = 2;

  if ( bSeamCheck &&  m_F.Count() > 0 && TC->m_T.Count() == m_V.Count() )
  {
    float* mesh_T = (float*)TC->m_T.Array();
    int mesh_T_stride = sizeof(TC->m_T[0])/sizeof(mesh_T[0]);
    if ( Tsd && Tside.Count() != m_V.Count() )
      Tsd = 0;
    AdjustMeshPeriodicTextureCoordinatesHelper( *this, mesh_xform, mesh_T, mesh_T_stride, Tsd ? Tside.Array() : 0, two_pi_tc, mp );
    mesh_T = 0; // when the array is grown, the pointer may become invalid
    if ( !mapping.m_uvw.IsIdentity() && !mapping.m_uvw.IsZero() )
    {
      // Apply the uvw transformation that is on mapping
      // to the texture coordinates.
      ON_3dPoint T;
      int vi, vcnt = TC->m_T.Count();
      ON_3fPoint* meshT = TC->m_T.Array();
      for ( vi = 0; vi < vcnt; vi++ )
      {
        T = meshT[vi];
        T = mapping.m_uvw*T;
        meshT[vi] = T;
      }
    }
  }

  return TC;
}